

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.hpp
# Opt level: O3

RecycledSyncObject<VulkanUtilities::VkSemaphoreType> * __thiscall
VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::
operator=(RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *this,
         RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *rhs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  Release(this);
  peVar1 = (rhs->m_pManager).
           super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (rhs->m_pManager).
           super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (rhs->m_pManager).
  super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (rhs->m_pManager).
  super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->m_pManager).
            super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->m_pManager).
  super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->m_pManager).
  super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  this->m_VkSyncObject = rhs->m_VkSyncObject;
  this->m_IsUnsignaled = rhs->m_IsUnsignaled;
  rhs->m_VkSyncObject = (NativeType)0x0;
  return this;
}

Assistant:

RecycledSyncObject& operator=(RecycledSyncObject&& rhs) noexcept
    {
        Release();
        m_pManager         = std::move(rhs.m_pManager);
        m_VkSyncObject     = rhs.m_VkSyncObject;
        m_IsUnsignaled     = rhs.m_IsUnsignaled;
        rhs.m_VkSyncObject = VK_NULL_HANDLE;
        return *this;
    }